

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

xmlTextReaderPtr xmlNewTextReader(xmlParserInputBufferPtr input,char *URI)

{
  xmlSAXHandlerPtr pxVar1;
  startElementSAXFunc p_Var2;
  endElementSAXFunc p_Var3;
  xmlTextReaderPtr __s;
  xmlBufPtr pxVar4;
  xmlSAXHandler *hdlr;
  size_t sVar5;
  xmlChar *chunk;
  xmlParserCtxtPtr pxVar6;
  uint size;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  
  if ((input != (xmlParserInputBufferPtr)0x0) &&
     (__s = (xmlTextReaderPtr)(*xmlMalloc)(0x160), __s != (xmlTextReaderPtr)0x0)) {
    memset(__s,0,0x160);
    __s->input = input;
    pxVar4 = xmlBufCreate(0x32);
    __s->buffer = pxVar4;
    if (pxVar4 != (xmlBufPtr)0x0) {
      hdlr = (xmlSAXHandler *)(*xmlMalloc)(0x100);
      __s->sax = hdlr;
      if (hdlr != (xmlSAXHandler *)0x0) {
        xmlSAXVersion(hdlr,2);
        pxVar1 = __s->sax;
        p_Var2 = pxVar1->startElement;
        p_Var3 = pxVar1->endElement;
        pxVar1->startElement = xmlTextReaderStartElement;
        __s->startElement = p_Var2;
        __s->endElement = p_Var3;
        pxVar1->endElement = xmlTextReaderEndElement;
        uVar7 = 0;
        uVar8 = 0;
        uVar9 = 0;
        uVar10 = 0;
        if (pxVar1->initialized == 0xdeedbeaf) {
          uVar7 = *(undefined4 *)&pxVar1->startElementNs;
          uVar8 = *(undefined4 *)((long)&pxVar1->startElementNs + 4);
          uVar9 = *(undefined4 *)&pxVar1->endElementNs;
          uVar10 = *(undefined4 *)((long)&pxVar1->endElementNs + 4);
          pxVar1->startElementNs = xmlTextReaderStartElementNs;
          pxVar1->endElementNs = xmlTextReaderEndElementNs;
        }
        *(undefined4 *)&__s->startElementNs = uVar7;
        *(undefined4 *)((long)&__s->startElementNs + 4) = uVar8;
        *(undefined4 *)&__s->endElementNs = uVar9;
        *(undefined4 *)((long)&__s->endElementNs + 4) = uVar10;
        __s->characters = pxVar1->characters;
        pxVar1->characters = xmlTextReaderCharacters;
        pxVar1->ignorableWhitespace = xmlTextReaderCharacters;
        __s->cdataBlock = pxVar1->cdataBlock;
        pxVar1->cdataBlock = xmlTextReaderCDataBlock;
        __s->mode = 0;
        __s->node = (xmlNodePtr)0x0;
        __s->curnode = (xmlNodePtr)0x0;
        sVar5 = xmlBufUse(__s->input->buffer);
        if (sVar5 < 4) {
          xmlParserInputBufferRead(input,4);
        }
        sVar5 = xmlBufUse(__s->input->buffer);
        pxVar1 = __s->sax;
        if (sVar5 < 4) {
          size = 0;
          chunk = (xmlChar *)0x0;
        }
        else {
          chunk = xmlBufContent(__s->input->buffer);
          size = 4;
        }
        pxVar6 = xmlCreatePushParserCtxt(pxVar1,(void *)0x0,(char *)chunk,size,URI);
        __s->ctxt = pxVar6;
        __s->base = 0;
        __s->cur = size;
        if (pxVar6 == (xmlParserCtxtPtr)0x0) {
          xmlBufFree(__s->buffer);
          (*xmlFree)(__s->sax);
          (*xmlFree)(__s);
          return (xmlTextReaderPtr)0x0;
        }
        pxVar6->parseMode = XML_PARSE_READER;
        pxVar6->_private = __s;
        pxVar6->linenumbers = 1;
        pxVar6->dictNames = 1;
        __s->allocs = 2;
        __s->dict = pxVar6->dict;
        __s->xinclude = 0;
        __s->patternMax = 0;
        __s->patternTab = (xmlPatternPtr *)0x0;
        return __s;
      }
      xmlBufFree(__s->buffer);
    }
    (*xmlFree)(__s);
  }
  return (xmlTextReaderPtr)0x0;
}

Assistant:

xmlTextReaderPtr
xmlNewTextReader(xmlParserInputBufferPtr input, const char *URI) {
    xmlTextReaderPtr ret;

    if (input == NULL)
	return(NULL);
    ret = xmlMalloc(sizeof(xmlTextReader));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0, sizeof(xmlTextReader));
    ret->doc = NULL;
    ret->entTab = NULL;
    ret->entMax = 0;
    ret->entNr = 0;
    ret->input = input;
    ret->buffer = xmlBufCreate(50);
    if (ret->buffer == NULL) {
        xmlFree(ret);
	return(NULL);
    }
    ret->sax = (xmlSAXHandler *) xmlMalloc(sizeof(xmlSAXHandler));
    if (ret->sax == NULL) {
	xmlBufFree(ret->buffer);
	xmlFree(ret);
	return(NULL);
    }
    xmlSAXVersion(ret->sax, 2);
    ret->startElement = ret->sax->startElement;
    ret->sax->startElement = xmlTextReaderStartElement;
    ret->endElement = ret->sax->endElement;
    ret->sax->endElement = xmlTextReaderEndElement;
#ifdef LIBXML_SAX1_ENABLED
    if (ret->sax->initialized == XML_SAX2_MAGIC) {
#endif /* LIBXML_SAX1_ENABLED */
	ret->startElementNs = ret->sax->startElementNs;
	ret->sax->startElementNs = xmlTextReaderStartElementNs;
	ret->endElementNs = ret->sax->endElementNs;
	ret->sax->endElementNs = xmlTextReaderEndElementNs;
#ifdef LIBXML_SAX1_ENABLED
    } else {
	ret->startElementNs = NULL;
	ret->endElementNs = NULL;
    }
#endif /* LIBXML_SAX1_ENABLED */
    ret->characters = ret->sax->characters;
    ret->sax->characters = xmlTextReaderCharacters;
    ret->sax->ignorableWhitespace = xmlTextReaderCharacters;
    ret->cdataBlock = ret->sax->cdataBlock;
    ret->sax->cdataBlock = xmlTextReaderCDataBlock;

    ret->mode = XML_TEXTREADER_MODE_INITIAL;
    ret->node = NULL;
    ret->curnode = NULL;
    if (xmlBufUse(ret->input->buffer) < 4) {
	xmlParserInputBufferRead(input, 4);
    }
    if (xmlBufUse(ret->input->buffer) >= 4) {
	ret->ctxt = xmlCreatePushParserCtxt(ret->sax, NULL,
			     (const char *) xmlBufContent(ret->input->buffer),
                                            4, URI);
	ret->base = 0;
	ret->cur = 4;
    } else {
	ret->ctxt = xmlCreatePushParserCtxt(ret->sax, NULL, NULL, 0, URI);
	ret->base = 0;
	ret->cur = 0;
    }

    if (ret->ctxt == NULL) {
	xmlBufFree(ret->buffer);
	xmlFree(ret->sax);
	xmlFree(ret);
	return(NULL);
    }
    ret->ctxt->parseMode = XML_PARSE_READER;
    ret->ctxt->_private = ret;
    ret->ctxt->linenumbers = 1;
    ret->ctxt->dictNames = 1;
    ret->allocs = XML_TEXTREADER_CTXT;
    /*
     * use the parser dictionary to allocate all elements and attributes names
     */
    ret->dict = ret->ctxt->dict;
#ifdef LIBXML_XINCLUDE_ENABLED
    ret->xinclude = 0;
#endif
#ifdef LIBXML_PATTERN_ENABLED
    ret->patternMax = 0;
    ret->patternTab = NULL;
#endif
    return(ret);
}